

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::
BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<short,_int,_int>_>
::BinaryViewExpression
          (BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<short,_int,_int>_>
           *this,ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                 *e1,
          ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *e2)

{
  View<short,_false,_std::allocator<unsigned_long>_> *pVVar1;
  View<int,_false,_std::allocator<unsigned_long>_> *pVVar2;
  size_t sVar3;
  size_t sVar4;
  bool local_29;
  ulong local_28;
  size_t j;
  ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *e2_local;
  ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *e1_local;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<short,_int,_int>_>
  *this_local;
  
  pVVar1 = ViewExpression::operator_cast_to_View_((ViewExpression *)e1);
  this->e1_ = pVVar1;
  pVVar2 = ViewExpression::operator_cast_to_View_((ViewExpression *)e2);
  this->e2_ = pVVar2;
  sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::size(this->e1_);
  local_29 = false;
  if (sVar3 != 0) {
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::size(this->e2_);
    local_29 = sVar3 != 0;
  }
  marray_detail::Assert<bool>(local_29);
  sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(this->e1_);
  sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  marray_detail::Assert<bool>(sVar3 == sVar4);
  local_28 = 0;
  while( true ) {
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(this->e1_);
    if (sVar3 <= local_28) break;
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::shape(this->e1_,local_28);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(this->e2_,local_28);
    marray_detail::Assert<bool>(sVar3 == sVar4);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

BinaryViewExpression(const ViewExpression<E1, T1>& e1, 
        const ViewExpression<E2, T2>& e2) 
        : e1_(e1), e2_(e2), // cast!
          binaryFunctor_(BinaryFunctor()) 
        {
            if(!MARRAY_NO_DEBUG) {
                marray_detail::Assert(e1_.size() != 0 && e2_.size() != 0);
                marray_detail::Assert(e1_.dimension() == e2_.dimension());
                for(std::size_t j=0; j<e1_.dimension(); ++j) {
                    marray_detail::Assert(e1_.shape(j) == e2_.shape(j));
                }
            }
        }